

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void string_suite::sanitize_10000000(void)

{
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1cc;
  size_type local_1c8 [4];
  undefined **local_1a8 [5];
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00114b78;
  local_1a8[1] = (undefined **)local_180;
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::value
                           ((basic_encoder<char,_24UL> *)local_1a8,anon_var_dwarf_82ff + 2);
  local_1cc = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(\"\\x80\")","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x29d,"void string_suite::sanitize_10000000()",local_1c8,&local_1cc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"\\\"?\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x29e,"void string_suite::sanitize_10000000()",local_1c8,"\"?\"");
  std::__cxx11::string::~string((string *)local_1c8);
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void sanitize_10000000()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value("\x80"), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\"?\"");
}